

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-heavy-traffic-deadlock-bug.c
# Opt level: O2

int ipc_helper_heavy_traffic_deadlock_bug(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  uv_pipe_t pipe;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&pipe,1);
  if (iVar1 == 0) {
    iVar1 = uv_pipe_open(&pipe,0);
    if (iVar1 == 0) {
      notify_parent_process();
      do_writes_and_reads((uv_stream_t *)&pipe);
      uv_sleep(100);
      loop = (uv_loop_t *)uv_default_loop();
      close_loop(loop);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      pcVar3 = "0 == uv_loop_close(uv_default_loop())";
      uVar2 = 0x9d;
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0x97;
    }
  }
  else {
    pcVar3 = "r == 0";
    uVar2 = 0x95;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-heavy-traffic-deadlock-bug.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

int ipc_helper_heavy_traffic_deadlock_bug(void) {
  uv_pipe_t pipe;
  int r;

  r = uv_pipe_init(uv_default_loop(), &pipe, 1);
  ASSERT(r == 0);
  r = uv_pipe_open(&pipe, 0);
  ASSERT(r == 0);

  notify_parent_process();
  do_writes_and_reads((uv_stream_t*) &pipe);
  uv_sleep(100);

  MAKE_VALGRIND_HAPPY();
  return 0;
}